

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent,QScreen*,double,double>
               (QScreen *args,double args_1,double args_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  WindowSystemEvent local_58;
  int *piStack_40;
  QScreen *local_38;
  double local_30;
  double dStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent,QScreen*,double,double>
              (args,args_1,args_2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_0033425b;
  }
  piStack_40 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QScreen *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = -NAN;
  dStack_28 = -NAN;
  local_58.type = ScreenLogicalDotsPerInch;
  local_58.flags = 0;
  local_58.eventAccepted = true;
  local_58._17_7_ = 0xaaaaaaaaaaaaaa;
  local_58._vptr_WindowSystemEvent = (_func_int **)&PTR__ScreenLogicalDotsPerInchEvent_007ea098;
  if (args == (QScreen *)0x0) {
    piStack_40 = (int *)0x0;
  }
  else {
    piStack_40 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_38 = args;
  local_30 = args_1;
  dStack_28 = args_2;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_58);
LAB_0033421a:
    uVar4 = local_58.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_58);
    if ((char)iVar3 != '\0') goto LAB_0033421a;
    uVar4 = 0;
  }
  local_58._vptr_WindowSystemEvent = (_func_int **)&PTR__ScreenLogicalDotsPerInchEvent_007ea098;
  if (piStack_40 != (int *)0x0) {
    LOCK();
    *piStack_40 = *piStack_40 + -1;
    UNLOCK();
    if ((*piStack_40 == 0) && (piStack_40 != (int *)0x0)) {
      operator_delete(piStack_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar4;
  }
LAB_0033425b:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}